

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_pre.hpp
# Opt level: O1

Array __thiscall notch::pre::OneHotEncoder::unapply(OneHotEncoder *this,Array *input)

{
  float **ppfVar1;
  float fVar2;
  float *pfVar3;
  float *pfVar4;
  pointer piVar5;
  pointer piVar6;
  long lVar7;
  pointer __s;
  float **ppfVar8;
  mapped_type *pmVar9;
  ostream *poVar10;
  invalid_argument *this_00;
  float **ppfVar11;
  long *in_RDX;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar12;
  long lVar13;
  float *extraout_RDX_01;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  float fVar19;
  Array AVar20;
  ostringstream ss;
  string local_1c8 [32];
  int local_1a8 [94];
  
  pfVar3 = (float *)*in_RDX;
  pfVar4 = input[5]._M_data;
  if (pfVar3 == (float *)(input[5]._M_size + (long)pfVar4)) {
    (this->super_ADatasetTransformer)._vptr_ADatasetTransformer =
         (_func_int **)((long)pfVar3 - (long)pfVar4);
    __s = (pointer)operator_new(((long)pfVar3 - (long)pfVar4) * 4);
    (this->inputColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = __s;
    pfVar12 = extraout_RDX;
    if (pfVar3 != pfVar4) {
      memset(__s,0,(long)pfVar3 * 4 + (long)pfVar4 * -4);
      ppfVar1 = &input[2]._M_data;
      lVar16 = 0;
      lVar14 = 0;
      pfVar12 = extraout_RDX_00;
      do {
        iVar15 = (int)lVar16;
        ppfVar8 = ppfVar1;
        for (ppfVar11 = (float **)input[3]._M_size; ppfVar11 != (float **)0x0;
            ppfVar11 = (float **)ppfVar11[(long)pfVar12 + 2]) {
          pfVar12 = (float *)(ulong)(*(int *)(ppfVar11 + 4) < iVar15);
          if (iVar15 <= *(int *)(ppfVar11 + 4)) {
            ppfVar8 = ppfVar11;
          }
        }
        ppfVar11 = ppfVar1;
        if ((ppfVar8 != ppfVar1) && (ppfVar11 = ppfVar8, iVar15 < *(int *)(ppfVar8 + 4))) {
          ppfVar11 = ppfVar1;
        }
        if (ppfVar11 == ppfVar1) {
          __s[lVar16] = *(int *)(in_RDX[1] + lVar14 * 4);
          lVar17 = 1;
        }
        else {
          local_1a8[0] = iVar15;
          pmVar9 = core::std::
                   map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                 *)(input + 2),local_1a8);
          piVar5 = (pmVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          piVar6 = (pmVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar17 = (long)piVar5 - (long)piVar6 >> 2;
          if (piVar5 == piVar6) {
            lVar18 = 0;
          }
          else {
            lVar13 = 0;
            lVar18 = 0;
            fVar19 = -3.4028235e+38;
            do {
              fVar2 = *(float *)(lVar14 * 4 + in_RDX[1] + lVar13 * 4);
              lVar7 = lVar13;
              if (fVar2 <= fVar19) {
                fVar2 = fVar19;
                lVar7 = lVar18;
              }
              lVar18 = lVar7;
              fVar19 = fVar2;
              lVar13 = lVar13 + 1;
            } while (lVar17 + (ulong)(lVar17 == 0) != lVar13);
          }
          local_1a8[0] = iVar15;
          pmVar9 = core::std::
                   map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                 *)(input + 2),local_1a8);
          __s[lVar16] = (int)(float)(pmVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_start[lVar18];
          pfVar12 = extraout_RDX_01;
        }
        lVar14 = lVar14 + lVar17;
        lVar16 = lVar16 + 1;
      } while (lVar16 != (long)pfVar3 - (long)pfVar4);
    }
    AVar20._M_data = pfVar12;
    AVar20._M_size = (size_t)this;
    return AVar20;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"input.size(): ",0xe);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", expected: ",0xc);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1c8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

virtual Array unapply(const Array &input) {
        if (input.size() != nInputCols + nExtraCols) {
            std::ostringstream ss;
            ss << "input.size(): " << input.size()
               << ", expected: " << nInputCols + nExtraCols;
            throw std::invalid_argument(ss.str());
        }
        Array output(0.0, input.size() - nExtraCols);
        size_t inCol = 0;
        for (size_t outCol = 0; outCol < output.size(); ++outCol) {
            if (columnValues.count(outCol)) { // replace with one column
                // find the column with the largest output
                size_t nColsPerFeature = columnValues[outCol].size();
                float maxVal = std::numeric_limits<float>::lowest();
                size_t maxIdx = 0;
                for (size_t i = 0; i < nColsPerFeature; ++i) {
                    if (input[inCol + i] > maxVal) {
                        maxVal = input[inCol + i];
                        maxIdx = i;
                    }
                }
                // use the category corresponding to the largest value
                output[outCol] = columnValues[outCol][maxIdx];
                inCol += nColsPerFeature;
            } else {
                output[outCol] = input[inCol];
                ++inCol;
            }
        }
        return output;
    }